

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O2

void lgx_rb_del(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  lgx_rb_node_t *plVar1;
  lgx_rb_node_s *plVar2;
  lgx_rb_node_t *__ptr;
  lgx_rb_node_s *plVar3;
  ulong uVar4;
  lgx_rb_node_t *plVar5;
  long *plVar6;
  uint uVar7;
  lgx_rb_node_t *plVar8;
  lgx_rb_node_t *node_00;
  
  plVar5 = node->left;
  plVar1 = node->right;
  __ptr = node;
  plVar8 = plVar1;
  if (plVar5 == (lgx_rb_node_t *)0x0) {
LAB_001176c7:
    node_00 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
    if (plVar8 != (lgx_rb_node_t *)0x0) goto LAB_001176e7;
    plVar8 = (lgx_rb_node_t *)0x0;
  }
  else {
    plVar2 = plVar1;
    if (plVar1 != (lgx_rb_node_t *)0x0) {
      do {
        __ptr = plVar2;
        plVar2 = __ptr->left;
      } while (__ptr->left != (lgx_rb_node_s *)0x0);
      plVar8 = __ptr->right;
      if (__ptr != node) {
        plVar5->parent_color = (ulong)((uint)plVar5->parent_color & 3) | (ulong)__ptr;
        __ptr->left = plVar5;
        node_00 = __ptr;
        if (__ptr != plVar1) {
          node_00 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
          plVar5 = node_00;
          if (plVar8 != (lgx_rb_node_t *)0x0) {
            plVar8->parent_color = (ulong)((uint)plVar8->parent_color & 3) | (ulong)node_00;
            plVar5 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
          }
          plVar5->left = plVar8;
          __ptr->right = plVar1;
          node->right->parent_color = (ulong)((uint)node->right->parent_color & 3) | (ulong)__ptr;
        }
        plVar5 = rbt->root;
        if (plVar5 == node) {
          rbt->root = __ptr;
          plVar6 = (long *)(node->parent_color & 0xfffffffffffffffc);
          plVar5 = __ptr;
        }
        else {
          plVar6 = (long *)(node->parent_color & 0xfffffffffffffffc);
          if ((lgx_rb_node_t *)*plVar6 == node) {
            *plVar6 = (long)__ptr;
          }
          else {
            plVar6[1] = (long)__ptr;
          }
        }
        uVar7 = (uint)__ptr->parent_color;
        uVar4 = (ulong)(uVar7 & 3);
        __ptr->parent_color = uVar4 | (ulong)plVar6;
        __ptr->parent_color =
             uVar4 & 0xfffffffffffffffe | (ulong)plVar6 | (ulong)((uint)node->parent_color & 1);
        node->parent_color = node->parent_color & 0xfffffffffffffffe | (ulong)(uVar7 & 1);
        __ptr = node;
        goto LAB_001177a3;
      }
      goto LAB_001176c7;
    }
    node_00 = (lgx_rb_node_t *)(node->parent_color & 0xfffffffffffffffc);
    plVar8 = plVar5;
LAB_001176e7:
    plVar8->parent_color = (ulong)((uint)plVar8->parent_color & 3) | (ulong)node_00;
  }
  plVar5 = rbt->root;
  if (plVar5 == node) {
    rbt->root = plVar8;
    plVar5 = plVar8;
  }
  else {
    plVar6 = (long *)(node->parent_color & 0xfffffffffffffffc);
    if ((lgx_rb_node_t *)*plVar6 == node) {
      *plVar6 = (long)plVar8;
    }
    else {
      plVar6[1] = (long)plVar8;
    }
  }
LAB_001177a3:
  if ((__ptr->parent_color & 1) != 0) {
    while (plVar8 != plVar5) {
      if ((plVar8 != (lgx_rb_node_t *)0x0) && (uVar4 = plVar8->parent_color, (uVar4 & 1) == 0))
      goto LAB_00117932;
      plVar5 = node_00->left;
      if (plVar8 == plVar5) {
        plVar5 = node_00->right;
        if ((plVar5->parent_color & 1) == 0) {
          plVar5->parent_color = plVar5->parent_color | 1;
          *(byte *)&node_00->parent_color = (byte)node_00->parent_color & 0xfe;
          rb_rotate_left(rbt,node_00);
          plVar5 = node_00->right;
        }
        plVar2 = plVar5->left;
        if ((plVar2 == (lgx_rb_node_s *)0x0) || ((plVar2->parent_color & 1) != 0)) {
          plVar3 = plVar5->right;
          if ((plVar3 == (lgx_rb_node_s *)0x0) || ((plVar3->parent_color & 1) != 0))
          goto LAB_0011785c;
LAB_001178d6:
          if ((plVar3->parent_color & 1) != 0) {
            if (plVar2 != (lgx_rb_node_s *)0x0) goto LAB_001178e1;
            goto LAB_001178e5;
          }
        }
        else {
          plVar3 = plVar5->right;
          if (plVar3 != (lgx_rb_node_s *)0x0) goto LAB_001178d6;
LAB_001178e1:
          *(byte *)&plVar2->parent_color = (byte)plVar2->parent_color | 1;
LAB_001178e5:
          *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color & 0xfe;
          rb_rotate_right(rbt,plVar5);
          plVar5 = node_00->right;
          plVar3 = plVar5->right;
        }
        plVar5->parent_color =
             plVar5->parent_color & 0xfffffffffffffffe | (ulong)((uint)node_00->parent_color & 1);
        *(byte *)&node_00->parent_color = (byte)node_00->parent_color | 1;
        if (plVar3 != (lgx_rb_node_s *)0x0) {
          *(byte *)&plVar3->parent_color = (byte)plVar3->parent_color | 1;
        }
        rb_rotate_left(rbt,node_00);
        break;
      }
      if ((plVar5->parent_color & 1) == 0) {
        plVar5->parent_color = plVar5->parent_color | 1;
        *(byte *)&node_00->parent_color = (byte)node_00->parent_color & 0xfe;
        rb_rotate_right(rbt,node_00);
        plVar5 = node_00->left;
      }
      plVar2 = plVar5->right;
      if ((plVar2 != (lgx_rb_node_s *)0x0) && ((plVar2->parent_color & 1) == 0)) {
        plVar3 = plVar5->left;
        if (plVar3 != (lgx_rb_node_s *)0x0) goto LAB_0011787b;
LAB_00117886:
        *(byte *)&plVar2->parent_color = (byte)plVar2->parent_color | 1;
LAB_0011788a:
        *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color & 0xfe;
        rb_rotate_left(rbt,plVar5);
        plVar5 = node_00->left;
        plVar3 = plVar5->left;
LAB_0011789c:
        plVar5->parent_color =
             plVar5->parent_color & 0xfffffffffffffffe | (ulong)((uint)node_00->parent_color & 1);
        *(byte *)&node_00->parent_color = (byte)node_00->parent_color | 1;
        if (plVar3 != (lgx_rb_node_s *)0x0) {
          *(byte *)&plVar3->parent_color = (byte)plVar3->parent_color | 1;
        }
        rb_rotate_right(rbt,node_00);
        break;
      }
      plVar3 = plVar5->left;
      if ((plVar3 != (lgx_rb_node_s *)0x0) && ((plVar3->parent_color & 1) == 0)) {
LAB_0011787b:
        if ((plVar3->parent_color & 1) != 0) {
          if (plVar2 != (lgx_rb_node_s *)0x0) goto LAB_00117886;
          goto LAB_0011788a;
        }
        goto LAB_0011789c;
      }
LAB_0011785c:
      *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color & 0xfe;
      plVar8 = node_00;
      node_00 = (lgx_rb_node_t *)(node_00->parent_color & 0xfffffffffffffffc);
      plVar5 = rbt->root;
    }
    if (plVar8 != (lgx_rb_node_t *)0x0) {
      uVar4 = plVar8->parent_color;
LAB_00117932:
      plVar8->parent_color = uVar4 | 1;
    }
  }
  lgx_str_cleanup(&__ptr->key);
  free(__ptr);
  rbt->size = rbt->size - 1;
  return;
}

Assistant:

void lgx_rb_del(lgx_rb_t * rbt, lgx_rb_node_t * node) {
    lgx_rb_node_t * y = node; // 将要被删除的结点 
    lgx_rb_node_t * x = NULL; // y 的唯一子节点
    lgx_rb_node_t * x_parent = NULL;

    // 这里我们确定了要删除的节点 y，并确定了其唯一字节点 x，注意 x 可能为 NULL
    if (y->left == 0) {             // node has at most one non-null child. y == node.  
        x = y->right;               // x might be null.  
    } else {  
        if (y->right == 0) {        // node has exactly one non-null child.  y == node.  
            x = y->left;            // x is not null.  
        } else {                    // node has two non-null children.  Set y to  
            y = y->right;           //   node's successor.  x might be null.  
            while (y->left != 0) {
                y = y->left;
            }
            x = y->right;
        }
    }

    if (y != node) {                 // relink y in place of z.  y is z's successor  
        // 移动 node 的左子节点，使其成为 y 的左子节点
        rb_set_parent(node->left, y);
        y->left = node->left;

        if (y != node->right) {
            x_parent = rb_parent(y);
            if (x) {
                rb_set_parent(x, rb_parent(y));
            }
            rb_parent(y)->left = x;      // y must be a left child

            y->right = node->right;
            rb_set_parent(node->right, y);
        } else {
            x_parent = y;
        }

        if (rbt->root == node) {
            rbt->root = y;
        } else if (rb_parent(node)->left == node) {
            rb_parent(node)->left = y;
        } else {
            rb_parent(node)->right = y;
        }
        rb_set_parent(y, rb_parent(node));

        // 交换 y 与 node 的颜色
        lgx_rb_color_t tmp = rb_color(y);
        rb_set_color(y, rb_color(node));
        rb_set_color(node, tmp);

        y = node;  
        // y now points to node to be actually deleted  
    } else {                        // y == node
        x_parent = rb_parent(y);  
        if (x) {
            rb_set_parent(x, rb_parent(y));
        }
        if (rbt->root == node) {
            rbt->root = x;  
        } else {
            if (rb_parent(node)->left == node) {
                rb_parent(node)->left = x;  
            } else {
                rb_parent(node)->right = x;
            }
        }
    }

    // 删除黑色结点后，导致黑色缺失，违背性质4,故对树进行调整 
    if( rb_is_black(y) ) {
        while (x != rbt->root && (!x || rb_is_black(x))) {
            if (x == x_parent->left) {
                lgx_rb_node_t* uncle = x_parent->right;
                if(rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_left(rbt, x_parent);  
                    uncle = x_parent->right;  
                }  
                if ((!uncle->left  || rb_is_black(uncle->left)) &&
                    (!uncle->right || rb_is_black(uncle->right))) {
                    rb_set_red(uncle);
                    x = x_parent;
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->right || rb_is_black(uncle->right)) {  
                        if (uncle->left) {
                            rb_set_black(uncle->left);
                        }
                        rb_set_red(uncle);
                        rb_rotate_right(rbt, uncle);
                        uncle = x_parent->right;
                    }
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->right) {
                        rb_set_black(uncle->right);
                    }
                    rb_rotate_left(rbt, x_parent);  
                    break;
                }
            } else {                  // same as above, with right <-> left.  
                lgx_rb_node_t* uncle = x_parent->left;
                if (rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_right(rbt, x_parent);  
                    uncle = x_parent->left;  
                }
                if ((!uncle->right || rb_is_black(uncle->right)) &&  
                    (!uncle->left  || rb_is_black(uncle->left))) {  
                    rb_set_red(uncle);
                    x = x_parent;  
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->left || rb_is_black(uncle->left)) {  
                        if (uncle->right) {
                            rb_set_black(uncle->right);
                        }
                        rb_set_red(uncle);
                        rb_rotate_left(rbt, uncle);  
                        uncle = x_parent->left;  
                    }  
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->left) {
                        rb_set_black(uncle->left);
                    }
                    rb_rotate_right(rbt, x_parent);  
                    break;  
                }  
            }
        }
        if (x) {
            rb_set_black(x);
        }
    }

    /* 删除 y */
    lgx_str_cleanup(&y->key);
    xfree(y);

    rbt->size --;
    
    //lgx_rbtree_print(rbt->root);
    //lgx_log_debug("rbtree delete\n");
}